

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

double load_param(char *param,double default_val,char *func)

{
  char *__nptr;
  char *local_40;
  char *str;
  char *numend;
  double result;
  char *func_local;
  double default_val_local;
  char *param_local;
  
  numend = (char *)0x7ff0000000000000;
  str = (char *)0x0;
  result = (double)func;
  func_local = (char *)default_val;
  default_val_local = (double)param;
  __nptr = getenv(param);
  if (__nptr == (char *)0x0) {
    local_40 = func_local;
  }
  else {
    local_40 = (char *)strtod(__nptr,&str);
  }
  numend = local_40;
  if ((((__nptr != (char *)0x0) && (str == __nptr)) ||
      (((double)local_40 == INFINITY && (!NAN((double)local_40))))) ||
     (((double)local_40 == -INFINITY && (!NAN((double)local_40))))) {
    numend = func_local;
    fprintf(_stderr,"%s: %s was not a finite positve floating point number. Using default: %g\n",
            func_local,result,default_val_local);
  }
  return (double)numend;
}

Assistant:

static double load_param(const char * param, double default_val, 
        const char * func ) 
{
    double result = HUGE_VAL;
    char * numend = NULL;
#if HAS_DUPENV_S_WIN32
    char * str = NULL;
    if (_dupenv_s( &str, NULL , param ))
        return default_val;
#else
    char * str = getenv(param);
#endif
    
    result = str?strtod( str, &numend ):default_val;
    
    if ( (str && numend == str) || result == HUGE_VAL 
            || result == -HUGE_VAL ) {
        result = default_val;
        fprintf(stderr, "%s: %s was not a finite positve "
                        "floating point number."
                        " Using default: %g\n", 
                        func, param, result );
    }
#if HAS_DUPENV_S_WIN32
    free(str);
#endif
    return result;
}